

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_severity.cc
# Opt level: O3

ostream * absl::lts_20240722::operator<<(ostream *os,LogSeverityAtMost s)

{
  ostream *poVar1;
  
  if ((uint)s < 4) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"<=",2);
    poVar1 = operator<<(os,s);
    return poVar1;
  }
  if (s == kNegativeInfinity) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"NEGATIVE_INFINITY",0x11);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, absl::LogSeverityAtMost s) {
  switch (s) {
    case absl::LogSeverityAtMost::kInfo:
    case absl::LogSeverityAtMost::kWarning:
    case absl::LogSeverityAtMost::kError:
    case absl::LogSeverityAtMost::kFatal:
      return os << "<=" << static_cast<absl::LogSeverity>(s);
    case absl::LogSeverityAtMost::kNegativeInfinity:
      return os << "NEGATIVE_INFINITY";
  }
  return os;
}